

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcLine,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcLine *in;
  
  in = (IfcLine *)operator_new(0x68);
  *(undefined ***)&in->field_0x50 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x58 = 0;
  *(char **)&in->field_0x60 = "IfcLine";
  Assimp::IFC::Schema_2x3::IfcCurve::IfcCurve((IfcCurve *)in,&PTR_construction_vtable_24__00865de8);
  *(undefined8 *)&(in->super_IfcCurve).field_0x38 = 0;
  (in->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcLine_00865d30;
  *(undefined ***)&in->field_0x50 = &PTR__IfcLine_00865dd0;
  *(undefined ***)
   &(in->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcLine_00865d58;
  *(undefined ***)
   &(in->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcLine_00865d80;
  *(undefined ***)&(in->super_IfcCurve).super_IfcGeometricRepresentationItem.field_0x30 =
       &PTR__IfcLine_00865da8;
  *(undefined8 *)&(in->super_IfcCurve).field_0x40 = 0;
  (in->Dir).obj = (LazyObject *)0x0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcLine>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcCurve).super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
               .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }